

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

QAbstractItemView * __thiscall
QAccessibleCalendarWidget::calendarView(QAccessibleCalendarWidget *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  QAbstractItemView *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  QLatin1StringView local_60;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  lVar1 = *(long *)(*(long *)(lVar3 + 8) + 0x20);
  lVar3 = *(long *)(*(long *)(lVar3 + 8) + 0x28);
  lVar5 = 0;
  do {
    if (lVar3 << 3 == lVar5) {
      pQVar4 = (QAbstractItemView *)0x0;
      break;
    }
    pQVar4 = *(QAbstractItemView **)(lVar1 + lVar5);
    QObject::objectName();
    local_60.m_size = 0x18;
    local_60.m_data = "qt_calendar_calendarview";
    bVar2 = ::operator==((QString *)&local_50,&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    lVar5 = lVar5 + 8;
  } while (!bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QAbstractItemView *QAccessibleCalendarWidget::calendarView() const
{
    for (QObject *child : calendarWidget()->children()) {
        if (child->objectName() == "qt_calendar_calendarview"_L1)
            return static_cast<QAbstractItemView *>(child);
    }
    return nullptr;
}